

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.h
# Opt level: O0

size_t absl::lts_20250127::log_internal::BufferSizeFor(uint64_t tag,WireType type)

{
  uint64_t value;
  size_t sVar1;
  size_t local_20;
  size_t buffer_size;
  WireType type_local;
  uint64_t tag_local;
  
  value = MakeTagType(tag,type);
  local_20 = VarintSize(value);
  switch(type) {
  case kVarint:
    sVar1 = MaxVarintSize();
    local_20 = sVar1 + local_20;
    break;
  case k64Bit:
    local_20 = local_20 + 8;
    break;
  case kLengthDelimited:
    sVar1 = MaxVarintSize();
    local_20 = sVar1 + local_20;
    break;
  case k32Bit:
    local_20 = local_20 + 4;
  }
  return local_20;
}

Assistant:

constexpr size_t BufferSizeFor(uint64_t tag, WireType type) {
  size_t buffer_size = VarintSize(MakeTagType(tag, type));
  switch (type) {
    case WireType::kVarint:
      buffer_size += MaxVarintSize();
      break;
    case WireType::k64Bit:
      buffer_size += size_t{8};
      break;
    case WireType::kLengthDelimited:
      buffer_size += MaxVarintSize();
      break;
    case WireType::k32Bit:
      buffer_size += size_t{4};
      break;
  }
  return buffer_size;
}